

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O2

void ec2AddALD(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  word *pwVar1;
  word *pwVar2;
  word *b_00;
  word *stack_00;
  size_t n;
  qr_o *pqVar3;
  bool_t bVar4;
  word *b_01;
  word *a_00;
  word *a_01;
  
  n = ec->f->n;
  pwVar1 = a + n + n;
  bVar4 = wwIsZero(pwVar1,n);
  pqVar3 = ec->f;
  if (bVar4 != 0) {
    wwCopy(c,b,pqVar3->n);
    wwCopy(c + n,b + n,ec->f->n);
    wwCopy(c + n + n,ec->f->unity,ec->f->n);
    return;
  }
  b_01 = (word *)(n * 8 + (long)stack);
  pwVar2 = b_01 + n;
  b_00 = pwVar2 + n;
  stack_00 = b_00 + n;
  (*pqVar3->sqr)((word *)stack,pwVar1,pqVar3,stack_00);
  (*ec->f->mul)((word *)stack,b + n,(word *)stack,ec->f,stack_00);
  wwXor2((word *)stack,a + n,ec->f->n);
  (*ec->f->mul)(b_01,b,pwVar1,ec->f,stack_00);
  wwXor2(b_01,a,ec->f->n);
  bVar4 = wwIsZero(b_01,ec->f->n);
  pqVar3 = ec->f;
  if (bVar4 != 0) {
    bVar4 = wwIsZero((word *)stack,pqVar3->n);
    if (bVar4 != 0) {
      ec2DblALD(c,b,ec,stack_00);
      return;
    }
    wwSetZero(c + n * 2,ec->f->n);
    return;
  }
  (*pqVar3->mul)(pwVar2,b_01,pwVar1,pqVar3,stack_00);
  pwVar1 = c + n;
  a_01 = pwVar1 + n;
  (*ec->f->sqr)(a_01,pwVar2,ec->f,stack_00);
  (*ec->f->mul)(b_00,b,a_01,ec->f,stack_00);
  wwXor(pwVar1,b,b + n,ec->f->n);
  (*ec->f->sqr)(c,b_01,ec->f,stack_00);
  wwXor2(c,(word *)stack,ec->f->n);
  bVar4 = wwEq(ec->A,ec->f->unity,ec->f->n);
  a_00 = pwVar2;
  if (bVar4 == 0) {
    bVar4 = wwIsZero(ec->A,ec->f->n);
    if (bVar4 != 0) goto LAB_0014389e;
    (*ec->f->mul)(b_01,ec->A,pwVar2,ec->f,stack_00);
    a_00 = b_01;
  }
  wwXor2(c,a_00,ec->f->n);
LAB_0014389e:
  (*ec->f->mul)(c,c,pwVar2,ec->f,stack_00);
  (*ec->f->sqr)(b_01,(word *)stack,ec->f,stack_00);
  wwXor2(c,b_01,ec->f->n);
  (*ec->f->sqr)(b_01,a_01,ec->f,stack_00);
  (*ec->f->mul)(pwVar1,pwVar1,b_01,ec->f,stack_00);
  wwXor2(b_00,c,ec->f->n);
  (*ec->f->mul)((word *)stack,(word *)stack,pwVar2,ec->f,stack_00);
  wwXor2((word *)stack,a_01,ec->f->n);
  (*ec->f->mul)((word *)stack,(word *)stack,b_00,ec->f,stack_00);
  wwXor2(pwVar1,(word *)stack,ec->f->n);
  return;
}

Assistant:

static void ec2AddALD(word c[], const word a[], const word b[],
	const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	stack = t4 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(ec2SeemsOnA(b, ec));
	ASSERT(wwIsSameOrDisjoint(a,  c, 3 * n));
	ASSERT(b == c || wwIsDisjoint2(b, 2 * n, c, 3 * n));
	// a == O => c <- (xb : yb : 1)
	if (qrIsZero(ecZ(a, n), ec->f))
	{
		qrCopy(ecX(c), ecX(b), ec->f);
		qrCopy(ecY(c, n), ecY(b, n), ec->f);
		qrSetUnity(ecZ(c, n), ec->f);
		return;
	}
	// t1 <- ya + yb za^2 [A]
	qrSqr(t1, ecZ(a, n), ec->f, stack);
	qrMul(t1, ecY(b, n), t1, ec->f, stack);
	gf2Add2(t1, ecY(a, n), ec->f);
	// t2 <- xa + xb za [B]
	qrMul(t2, ecX(b), ecZ(a, n), ec->f, stack);
	gf2Add2(t2, ecX(a), ec->f);
	// t2 == 0 => a == \pm b
	if (qrIsZero(t2, ec->f))
	{
		// t1 == 0 => a == b => c <- 2b
		if (qrIsZero(t1, ec->f))
			ec2DblALD(c, b, ec, stack);
		// t1 != 0 => a == -b => c <- O
		else
			qrSetZero(ecZ(c, n), ec->f);
		return;
	}
	// t3 <- t2 za [C]
	qrMul(t3, t2, ecZ(a, n), ec->f, stack);
	// zc <- t3^2 [C^2]
	qrSqr(ecZ(c, n), t3, ec->f, stack);
	// t4 <- xb zc [D]
	qrMul(t4, ecX(b), ecZ(c, n), ec->f, stack);
	// yc <- xb + yb [X2 + Y2]
	gf2Add(ecY(c, n), ecX(b), ecY(b, n), ec->f);
	// xc <- t2^2 + t1 + A t3 [B^2 + A + a2 * C]
	qrSqr(ecX(c), t2, ec->f, stack);
	gf2Add2(ecX(c), t1, ec->f);
	if (qrIsUnity(ec->A, ec->f))
		gf2Add2(ecX(c), t3, ec->f);
	else if (!qrIsZero(ec->A, ec->f))
	{
		qrMul(t2, ec->A, t3, ec->f, stack);
		gf2Add2(ecX(c), t2, ec->f);
	}
	// xc <- xc t3 + t1^2 [C * (A + B^2 + a2 * C) + A^2]
	qrMul(ecX(c), ecX(c), t3, ec->f, stack);
	qrSqr(t2, t1, ec->f, stack);
	gf2Add2(ecX(c), t2, ec->f);
	// yc <- yc zc^2 [(Y2 + X2) * Z3^2]
	qrSqr(t2, ecZ(c, n), ec->f, stack);
	qrMul(ecY(c, n), ecY(c, n), t2, ec->f, stack);
	// t4 <- t4 + xc [D + X3]
	gf2Add2(t4, ecX(c), ec->f);
	// t1 <- t1 t3 + zc [A * C + Z3]
	qrMul(t1, t1, t3, ec->f, stack);
	gf2Add2(t1, ecZ(c, n), ec->f);
	// t1 <- t1 t4 [(D + X3)(A * C + Z3)]
	qrMul(t1, t1, t4, ec->f, stack);
	// yc <- yc + t1 [(D + X3)(A * C + Z3) + (Y2 + X2) * Z3^2]
	gf2Add2(ecY(c, n), t1, ec->f);
}